

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Option<unsigned_long> Catch::list(Config *config)

{
  bool bVar1;
  undefined1 uVar2;
  unsigned_long uVar3;
  Option<unsigned_long> *_other;
  size_t sVar4;
  char extraout_RDX [8];
  char extraout_RDX_00 [8];
  char acVar5 [8];
  Config *in_RSI;
  Option<unsigned_long> *in_RDI;
  Option<unsigned_long> OVar6;
  Config *in_stack_00000050;
  Option<unsigned_long> *listedCount;
  Config *in_stack_000001e0;
  Config *in_stack_00000260;
  Option<unsigned_long> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  unsigned_long local_88;
  char *local_80;
  Option<unsigned_long> local_78;
  unsigned_long local_68;
  unsigned_long local_60;
  Option<unsigned_long> local_58;
  unsigned_long local_48;
  unsigned_long local_40;
  Option<unsigned_long> local_38 [2];
  undefined1 local_11;
  Config *local_10;
  
  local_11 = 0;
  local_10 = in_RSI;
  Option<unsigned_long>::Option(in_RDI);
  bVar1 = Config::listTests(local_10);
  if (bVar1) {
    local_48 = 0;
    uVar3 = Option<unsigned_long>::valueOr(in_RDI,&local_48);
    sVar4 = listTests(in_stack_00000260);
    local_40 = uVar3 + sVar4;
    Option<unsigned_long>::Option(local_38,&local_40);
    Option<unsigned_long>::operator=
              ((Option<unsigned_long> *)
               CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
    Option<unsigned_long>::~Option((Option<unsigned_long> *)0x19a447);
  }
  bVar1 = Config::listTags(local_10);
  if (bVar1) {
    local_68 = 0;
    uVar3 = Option<unsigned_long>::valueOr(in_RDI,&local_68);
    sVar4 = listTags(in_stack_000001e0);
    local_60 = uVar3 + sVar4;
    Option<unsigned_long>::Option(&local_58,&local_60);
    Option<unsigned_long>::operator=
              ((Option<unsigned_long> *)
               CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
               in_stack_ffffffffffffff28);
    Option<unsigned_long>::~Option((Option<unsigned_long> *)0x19a52e);
  }
  uVar2 = Config::listReporters(local_10);
  acVar5 = extraout_RDX;
  if ((bool)uVar2) {
    local_88 = 0;
    _other = (Option<unsigned_long> *)Option<unsigned_long>::valueOr(in_RDI,&local_88);
    sVar4 = listReporters(in_stack_00000050);
    local_80 = _other->storage + (sVar4 - 8);
    Option<unsigned_long>::Option(&local_78,(unsigned_long *)&local_80);
    Option<unsigned_long>::operator=
              ((Option<unsigned_long> *)CONCAT17(uVar2,in_stack_ffffffffffffff30),_other);
    Option<unsigned_long>::~Option((Option<unsigned_long> *)0x19a5e7);
    acVar5 = extraout_RDX_00;
  }
  OVar6.storage[0] = acVar5[0];
  OVar6.storage[1] = acVar5[1];
  OVar6.storage[2] = acVar5[2];
  OVar6.storage[3] = acVar5[3];
  OVar6.storage[4] = acVar5[4];
  OVar6.storage[5] = acVar5[5];
  OVar6.storage[6] = acVar5[6];
  OVar6.storage[7] = acVar5[7];
  OVar6.nullableValue = (unsigned_long *)in_RDI;
  return OVar6;
}

Assistant:

inline Option<std::size_t> list( Config const& config ) {
        Option<std::size_t> listedCount;
        if( config.listTests() )
            listedCount = listedCount.valueOr(0) + listTests( config );
        if( config.listTags() )
            listedCount = listedCount.valueOr(0) + listTags( config );
        if( config.listReporters() )
            listedCount = listedCount.valueOr(0) + listReporters( config );
        return listedCount;
    }